

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharStringCache.cpp
# Opt level: O0

JavascriptString * __thiscall Js::CharStringCache::GetStringForCharW(CharStringCache *this,char16 c)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  JavascriptLibrary *this_00;
  ulong uVar4;
  BaseDictionary<char16_t,_Js::JavascriptString_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  **ppBVar5;
  Recycler *pRVar6;
  BaseDictionary<char16_t,_Js::JavascriptString_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *pBVar7;
  TrackAllocData local_58;
  Recycler *local_30;
  Recycler *recycler;
  ScriptContext *scriptContext;
  JavascriptString *str;
  CharStringCache *pCStack_10;
  char16 c_local;
  CharStringCache *this_local;
  
  str._6_2_ = c;
  pCStack_10 = this;
  bVar2 = JavascriptString::IsASCII7BitChar(c);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/CharStringCache.cpp"
                                ,0x36,"(!JavascriptString::IsASCII7BitChar(c))",
                                "!JavascriptString::IsASCII7BitChar(c)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  this_00 = JavascriptLibrary::FromCharStringCache(this);
  recycler = (Recycler *)JavascriptLibrary::GetScriptContext(this_00);
  uVar4 = (**(code **)(*(long *)recycler + 0x120))();
  if ((uVar4 & 1) == 0) {
    ppBVar5 = Memory::WriteBarrierPtr::operator_cast_to_BaseDictionary__
                        ((WriteBarrierPtr *)&this->charStringCache);
    if (*ppBVar5 ==
        (BaseDictionary<char16_t,_Js::JavascriptString_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
         *)0x0) {
      pRVar6 = ScriptContext::GetRecycler((ScriptContext *)recycler);
      local_30 = pRVar6;
      Memory::TrackAllocData::CreateTrackAllocData
                (&local_58,
                 (type_info *)
                 &JsUtil::
                  BaseDictionary<char16_t,Js::JavascriptString*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                  ::typeinfo,0,0xffffffffffffffff,
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/CharStringCache.cpp"
                 ,0x3e);
      pRVar6 = Memory::Recycler::TrackAllocInfo(pRVar6,&local_58);
      pBVar7 = (BaseDictionary<char16_t,_Js::JavascriptString_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                *)new<Memory::Recycler>(0x38,pRVar6,0x43c4b0);
      JsUtil::
      BaseDictionary<char16_t,_Js::JavascriptString_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
      ::BaseDictionary(pBVar7,local_30,0x11);
      Memory::
      WriteBarrierPtr<JsUtil::BaseDictionary<char16_t,_Js::JavascriptString_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
      ::operator=(&this->charStringCache,pBVar7);
    }
    pBVar7 = Memory::
             WriteBarrierPtr<JsUtil::BaseDictionary<char16_t,_Js::JavascriptString_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
             ::operator->(&this->charStringCache);
    bVar2 = JsUtil::
            BaseDictionary<char16_t,_Js::JavascriptString_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            ::TryGetValue<char16_t>
                      (pBVar7,(char16_t *)((long)&str + 6),(JavascriptString **)&scriptContext);
    if (!bVar2) {
      scriptContext = (ScriptContext *)SingleCharString::New(str._6_2_,(ScriptContext *)recycler);
      pBVar7 = Memory::
               WriteBarrierPtr<JsUtil::BaseDictionary<char16_t,_Js::JavascriptString_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
               ::operator->(&this->charStringCache);
      JsUtil::
      BaseDictionary<char16_t,_Js::JavascriptString_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
      ::Add(pBVar7,(char16_t *)((long)&str + 6),(JavascriptString **)&scriptContext);
    }
  }
  else {
    scriptContext = (ScriptContext *)SingleCharString::New(str._6_2_,(ScriptContext *)recycler);
  }
  return (JavascriptString *)scriptContext;
}

Assistant:

JavascriptString* CharStringCache::GetStringForCharW(char16 c)
    {
        Assert(!JavascriptString::IsASCII7BitChar(c));
        JavascriptString* str;
        ScriptContext * scriptContext = JavascriptLibrary::FromCharStringCache(this)->GetScriptContext();
        if (!scriptContext->IsClosed())
        {
            if (charStringCache == nullptr)
            {
                Recycler * recycler = scriptContext->GetRecycler();
                charStringCache = RecyclerNew(recycler, CharStringCacheMap, recycler, 17);
            }
            if (!charStringCache->TryGetValue(c, &str))
            {
                str = SingleCharString::New(c, scriptContext);
                charStringCache->Add(c, str);
            }
        }
        else
        {
            str = SingleCharString::New(c, scriptContext);
        }
        return str;
    }